

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t difference_vector16(uint16_t *A,size_t s_a,uint16_t *B,size_t s_b,uint16_t *C)

{
  uint16_t uVar1;
  ushort uVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong local_258;
  size_t i;
  uint16_t b;
  undefined8 uStack_248;
  uint16_t a;
  __m128i p_1;
  __m128i sm16_1;
  int bitmask_belongs_to_difference_1;
  __m128i a_found_in_b_1;
  uint16_t buffer [8];
  __m128i p;
  __m128i sm16;
  int bitmask_belongs_to_difference;
  uint16_t b_max;
  uint16_t a_max;
  __m128i a_found_in_b;
  __m128i runningmask_a_found_in_b;
  __m128i v_b;
  __m128i v_a;
  size_t st_b;
  size_t st_a;
  size_t vectorlength;
  size_t i_b;
  size_t i_a;
  int32_t count;
  uint16_t *C_local;
  size_t s_b_local;
  uint16_t *B_local;
  size_t s_a_local;
  uint16_t *A_local;
  ulong uStack_60;
  ulong uStack_50;
  
  if (s_a == 0) {
    return 0;
  }
  if (s_b == 0) {
    if (A != C) {
      memcpy(C,A,s_a << 1);
    }
    return (int32_t)s_a;
  }
  i_a._4_4_ = 0;
  C_local = (uint16_t *)s_b;
  s_b_local = (size_t)B;
  B_local = (uint16_t *)s_a;
  s_a_local = (size_t)A;
  if ((*A == 0) || (*B == 0)) {
    if ((*A == 0) && (*B == 0)) {
      s_a_local = (size_t)(A + 1);
      B_local = (uint16_t *)(s_a - 1);
      s_b_local = (size_t)(B + 1);
      C_local = (uint16_t *)(s_b - 1);
    }
    else {
      uVar1 = *A;
      if (uVar1 != 0) {
        s_b_local = (size_t)(B + 1);
        C_local = (uint16_t *)(s_b - 1);
      }
      else {
        *C = 0;
        s_a_local = (size_t)(A + 1);
        B_local = (uint16_t *)(s_a - 1);
      }
      i_a._4_4_ = (uint)(uVar1 == 0);
    }
  }
  i_b = 0;
  vectorlength = 0;
  uVar7 = (ulong)B_local & 0xfffffffffffffff8;
  if ((uVar7 != 0) && (((ulong)C_local & 0xfffffffffffffff8) != 0)) {
    unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])s_a_local);
    unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])s_b_local);
    uStack_50 = SUB168(ZEXT816(0),4);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uStack_50;
    stack0xfffffffffffffe48 = auVar4 << 0x40;
LAB_00102255:
    vpcmpistrm_avx(stack0xfffffffffffffe58,stack0xfffffffffffffe68,1);
    unique0x000ff780 = vpor_avx(stack0xfffffffffffffe48,stack0xfffffffffffffe58);
    uVar2 = *(ushort *)(s_a_local + (i_b + 7) * 2);
    uVar3 = *(ushort *)(s_b_local + (vectorlength + 7) * 2);
    if (uVar2 <= uVar3) {
      auVar4 = vpshufb_avx(stack0xfffffffffffffe68,
                           *(undefined1 (*) [16])
                            (shuffle_mask16 + (long)(int)((uint)a_found_in_b[1] ^ 0xff) * 0x10));
      buffer._8_8_ = auVar4._0_8_;
      p[0] = auVar4._8_8_;
      *(undefined8 *)(C + (int)i_a._4_4_) = buffer._8_8_;
      *(longlong *)(C + (int)i_a._4_4_ + 4) = p[0];
      i_a._4_4_ = POPCOUNT((uint)a_found_in_b[1] ^ 0xff) + i_a._4_4_;
      i_b = i_b + 8;
      if (i_b == uVar7) goto LAB_00102496;
      uStack_60 = SUB168(ZEXT816(0),4);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uStack_60;
      stack0xfffffffffffffe48 = auVar6 << 0x40;
      unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])(s_a_local + i_b * 2));
    }
    if (uVar3 <= uVar2) {
      vectorlength = vectorlength + 8;
      if (vectorlength == ((ulong)C_local & 0xfffffffffffffff8)) goto LAB_00102496;
      unique0x000f2500 = vlddqu_avx(*(undefined1 (*) [16])(s_b_local + vectorlength * 2));
    }
    goto LAB_00102255;
  }
LAB_00102644:
  while (i_b < B_local && vectorlength < C_local) {
    uVar2 = *(ushort *)(s_a_local + i_b * 2);
    uVar3 = *(ushort *)(s_b_local + vectorlength * 2);
    if (uVar3 < uVar2) {
      vectorlength = vectorlength + 1;
    }
    else {
      if (uVar2 < uVar3) {
        C[(int)i_a._4_4_] = uVar2;
        i_a._4_4_ = i_a._4_4_ + 1;
      }
      else {
        vectorlength = vectorlength + 1;
      }
      i_b = i_b + 1;
    }
  }
  if (i_b < B_local) {
    if (C == (uint16_t *)s_a_local) {
      if (i_b < (ulong)(long)(int)i_a._4_4_) {
        __assert_fail("(size_t)count <= i_a",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1e21,
                      "int32_t difference_vector16(const uint16_t *restrict, size_t, const uint16_t *restrict, size_t, uint16_t *)"
                     );
      }
      if ((ulong)(long)(int)i_a._4_4_ < i_b) {
        memmove(C + (int)i_a._4_4_,(void *)(s_a_local + i_b * 2),((long)B_local - i_b) * 2);
      }
    }
    else {
      for (local_258 = 0; local_258 < (long)B_local - i_b; local_258 = local_258 + 1) {
        C[(long)(int)i_a._4_4_ + local_258] = *(uint16_t *)(s_a_local + (local_258 + i_b) * 2);
      }
    }
    i_a._4_4_ = ((int)B_local - (int)i_b) + i_a._4_4_;
  }
  return i_a._4_4_;
LAB_00102496:
  if (i_b < uVar7) {
    a_found_in_b_1[1] = 0;
    memcpy(a_found_in_b_1 + 1,(void *)(s_b_local + vectorlength * 2),
           ((long)C_local - vectorlength) * 2);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = a_found_in_b_1[1];
    auVar4 = vlddqu_avx(auVar5);
    vpcmpistrm_avx(auVar4,stack0xfffffffffffffe68,1);
    auVar4 = vpor_avx(stack0xfffffffffffffe48,auVar4);
    a_found_in_b[1]._0_4_ = auVar4._0_4_;
    auVar4 = vpshufb_avx(stack0xfffffffffffffe68,
                         *(undefined1 (*) [16])
                          (shuffle_mask16 + (long)(int)((uint)a_found_in_b[1] ^ 0xff) * 0x10));
    uStack_248 = auVar4._0_8_;
    p_1[0] = auVar4._8_8_;
    *(undefined8 *)(C + (int)i_a._4_4_) = uStack_248;
    *(longlong *)(C + (int)i_a._4_4_ + 4) = p_1[0];
    i_a._4_4_ = POPCOUNT((uint)a_found_in_b[1] ^ 0xff) + i_a._4_4_;
    i_b = i_b + 8;
  }
  goto LAB_00102644;
}

Assistant:

int32_t difference_vector16(const uint16_t *__restrict__ A, size_t s_a,
                            const uint16_t *__restrict__ B, size_t s_b,
                            uint16_t *C) {
    // we handle the degenerate case
    if (s_a == 0) return 0;
    if (s_b == 0) {
        if (A != C) memcpy(C, A, sizeof(uint16_t) * s_a);
        return (int32_t)s_a;
    }
    // handle the leading zeroes, it is messy but it allows us to use the fast
    // _mm_cmpistrm instrinsic safely
    int32_t count = 0;
    if ((A[0] == 0) || (B[0] == 0)) {
        if ((A[0] == 0) && (B[0] == 0)) {
            A++;
            s_a--;
            B++;
            s_b--;
        } else if (A[0] == 0) {
            C[count++] = 0;
            A++;
            s_a--;
        } else {
            B++;
            s_b--;
        }
    }
    // at this point, we have two non-empty arrays, made of non-zero
    // increasing values.
    size_t i_a = 0, i_b = 0;
    const size_t vectorlength = sizeof(__m128i) / sizeof(uint16_t);
    const size_t st_a = (s_a / vectorlength) * vectorlength;
    const size_t st_b = (s_b / vectorlength) * vectorlength;
    if ((i_a < st_a) && (i_b < st_b)) {  // this is the vectorized code path
        __m128i v_a, v_b;                //, v_bmax;
        // we load a vector from A and a vector from B
        v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
        v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
        // we have a runningmask which indicates which values from A have been
        // spotted in B, these don't get written out.
        __m128i runningmask_a_found_in_b = _mm_setzero_si128();
        /****
        * start of the main vectorized loop
        *****/
        while (true) {
            // afoundinb will contain a mask indicate for each entry in A
            // whether it is seen
            // in B
            const __m128i a_found_in_b =
                _mm_cmpistrm(v_b, v_a, _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY |
                                           _SIDD_BIT_MASK);
            runningmask_a_found_in_b =
                _mm_or_si128(runningmask_a_found_in_b, a_found_in_b);
            // we always compare the last values of A and B
            const uint16_t a_max = A[i_a + vectorlength - 1];
            const uint16_t b_max = B[i_b + vectorlength - 1];
            if (a_max <= b_max) {
                // Ok. In this code path, we are ready to write our v_a
                // because there is no need to read more from B, they will
                // all be large values.
                const int bitmask_belongs_to_difference =
                    _mm_extract_epi32(runningmask_a_found_in_b, 0) ^ 0xFF;
                /*** next few lines are probably expensive *****/
                __m128i sm16 = _mm_load_si128((const __m128i *)shuffle_mask16 +
                                              bitmask_belongs_to_difference);
                __m128i p = _mm_shuffle_epi8(v_a, sm16);
                _mm_storeu_si128((__m128i *)&C[count], p);  // can overflow
                count += _mm_popcnt_u32(bitmask_belongs_to_difference);
                // we advance a
                i_a += vectorlength;
                if (i_a == st_a)  // no more
                    break;
                runningmask_a_found_in_b = _mm_setzero_si128();
                v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
            }
            if (b_max <= a_max) {
                // in this code path, the current v_b has become useless
                i_b += vectorlength;
                if (i_b == st_b) break;
                v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
            }
        }
        // at this point, either we have i_a == st_a, which is the end of the
        // vectorized processing,
        // or we have i_b == st_b,  and we are not done processing the vector...
        // so we need to finish it off.
        if (i_a < st_a) {        // we have unfinished business...
            uint16_t buffer[8];  // buffer to do a masked load
            memset(buffer, 0, 8 * sizeof(uint16_t));
            memcpy(buffer, B + i_b, (s_b - i_b) * sizeof(uint16_t));
            v_b = _mm_lddqu_si128((__m128i *)buffer);
            const __m128i a_found_in_b =
                _mm_cmpistrm(v_b, v_a, _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY |
                                           _SIDD_BIT_MASK);
            runningmask_a_found_in_b =
                _mm_or_si128(runningmask_a_found_in_b, a_found_in_b);
            const int bitmask_belongs_to_difference =
                _mm_extract_epi32(runningmask_a_found_in_b, 0) ^ 0xFF;
            __m128i sm16 = _mm_load_si128((const __m128i *)shuffle_mask16 +
                                          bitmask_belongs_to_difference);
            __m128i p = _mm_shuffle_epi8(v_a, sm16);
            _mm_storeu_si128((__m128i *)&C[count], p);  // can overflow
            count += _mm_popcnt_u32(bitmask_belongs_to_difference);
            i_a += vectorlength;
        }
        // at this point we should have i_a == st_a and i_b == st_b
    }
    // do the tail using scalar code
    while (i_a < s_a && i_b < s_b) {
        uint16_t a = A[i_a];
        uint16_t b = B[i_b];
        if (b < a) {
            i_b++;
        } else if (a < b) {
            C[count] = a;
            count++;
            i_a++;
        } else {  //==
            i_a++;
            i_b++;
        }
    }
    if (i_a < s_a) {
        if(C == A) {
          assert((size_t)count <= i_a);
          if((size_t)count < i_a) {
            memmove(C + count, A + i_a, sizeof(uint16_t) * (s_a - i_a));
          }
        } else {
           for(size_t i = 0; i < (s_a - i_a); i++) {
                C[count + i] = A[i + i_a];
           }
        }
        count += (int32_t)(s_a - i_a);
    }
    return count;
}